

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_efsctui(CPUPPCState_conflict *env,uint32_t val)

{
  uint32_t uVar1;
  uint32_t val_local;
  CPUPPCState_conflict *env_local;
  
  uVar1 = efsctui(env,val);
  return uVar1;
}

Assistant:

static inline uint32_t efsctui(CPUPPCState *env, uint32_t val)
{
    CPU_FloatU u;

    u.l = val;
    /* NaN are not treated the same way IEEE 754 does */
    if (unlikely(float32_is_quiet_nan(u.f, &env->vec_status))) {
        return 0;
    }

    return float32_to_uint32(u.f, &env->vec_status);
}